

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

DOMElement * __thiscall
xercesc_4_0::TraverseSchema::checkContent
          (TraverseSchema *this,DOMElement *rootElem,DOMElement *contentElem,bool isEmpty,
          bool processAnnot)

{
  bool bVar1;
  int iVar2;
  XMLCh *text1;
  undefined4 extraout_var;
  XSAnnotation *pXVar3;
  DOMElement *elem;
  undefined4 extraout_var_00;
  
  text1 = getElementAttValue(this,rootElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  this->fAnnotation = (XSAnnotation *)0x0;
  if (contentElem == (DOMElement *)0x0) {
    if (!isEmpty) {
      reportSchemaError(this,rootElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x23,text1,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (DOMElement *)0x0;
    }
  }
  else {
    iVar2 = (*(contentElem->super_DOMNode)._vptr_DOMNode[0x18])(contentElem);
    bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),
                              (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (!bVar1) {
      return contentElem;
    }
    if (processAnnot) {
      pXVar3 = traverseAnnotationDecl(this,contentElem,this->fNonXSAttList,false);
    }
    else {
      pXVar3 = (XSAnnotation *)0x0;
    }
    elem = XUtil::getNextSiblingElement(&contentElem->super_DOMNode);
    if (elem == (DOMElement *)0x0) {
      if (!isEmpty) {
        reportSchemaError(this,contentElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x23,text1,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      this->fAnnotation = pXVar3;
    }
    else {
      iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0x18])(elem);
      bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar2),
                                (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
      if (!bVar1) {
        this->fAnnotation = pXVar3;
        return elem;
      }
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x3d,text1,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      if (pXVar3 != (XSAnnotation *)0x0) {
        (*(pXVar3->super_XSerializable)._vptr_XSerializable[1])(pXVar3);
      }
    }
  }
  return (DOMElement *)0x0;
}

Assistant:

DOMElement* TraverseSchema::checkContent( const DOMElement* const rootElem
                                        , DOMElement* const contentElem
                                        , const bool isEmpty
                                        , const bool processAnnot)
{
    DOMElement* content = contentElem;
    const XMLCh* name = getElementAttValue(rootElem,SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    fAnnotation = 0;
    Janitor<XSAnnotation> janAnnot(0);
    if (!content) {

       if (!isEmpty) {
           reportSchemaError(rootElem, XMLUni::fgXMLErrDomain, XMLErrs::ContentError, name);
       }

       return 0;
    }

    if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {

        if (processAnnot) {
            janAnnot.reset(traverseAnnotationDecl(content, fNonXSAttList));
        }
        content = XUtil::getNextSiblingElement(content);

        if (!content) { // must be followed by content

            if (!isEmpty) {
                reportSchemaError(contentElem, XMLUni::fgXMLErrDomain, XMLErrs::ContentError, name);
            }
            fAnnotation = janAnnot.release();
            return 0;
        }

        if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {

            reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnnotationError, name);
            return 0;
        }
        fAnnotation = janAnnot.release();
    }
    return content;
}